

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O0

void get_FMlong8(FMFieldPtr field,void *data,unsigned_long *low_long,long *high_long)

{
  size_t sVar1;
  size_t *in_RCX;
  size_t *in_RDX;
  long in_RDI;
  longdouble in_ST0;
  longdouble tmp;
  FMgetFieldStruct tmp_field;
  size_t high_bytes_offset;
  size_t low_bytes_offset;
  undefined4 in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9c;
  undefined2 in_stack_ffffffffffffff9e;
  FMFieldPtr in_stack_ffffffffffffffa0;
  
  *in_RDX = 0;
  if (in_RCX != (size_t *)0x0) {
    *in_RCX = 0;
  }
  if (*(int *)(in_RDI + 0xc) == 1) {
    if (*(int *)(in_RDI + 8) == 0x10) {
      sVar1 = get_FMulong(in_stack_ffffffffffffffa0,
                          (void *)CONCAT26(in_stack_ffffffffffffff9e,
                                           CONCAT24(in_stack_ffffffffffffff9c,
                                                    in_stack_ffffffffffffff98)));
      *in_RDX = sVar1;
      if (in_RCX != (size_t *)0x0) {
        sVar1 = get_FMlong(in_stack_ffffffffffffffa0,
                           (void *)CONCAT26(in_stack_ffffffffffffff9e,
                                            CONCAT24(in_stack_ffffffffffffff9c,
                                                     in_stack_ffffffffffffff98)));
        *in_RCX = sVar1;
      }
    }
    else {
      sVar1 = get_FMlong(in_stack_ffffffffffffffa0,
                         (void *)CONCAT26(in_stack_ffffffffffffff9e,
                                          CONCAT24(in_stack_ffffffffffffff9c,
                                                   in_stack_ffffffffffffff98)));
      *in_RDX = sVar1;
    }
  }
  else {
    if (*(int *)(in_RDI + 0xc) != 3) {
      fprintf(_stderr,"Get IOlong8 failed on invalid data type!\n");
      exit(1);
    }
    get_big_float(stack0x00000018,tmp._0_8_);
    *in_RDX = (long)ROUND(in_ST0);
  }
  return;
}

Assistant:

extern void
get_FMlong8(FMFieldPtr field, void *data, unsigned long *low_long, long *high_long)
{
    *low_long = 0;
    if (high_long)
	*high_long = 0;
    if (field->data_type == integer_type) {
	if (field->size == 2 * sizeof(long)) {
	    size_t low_bytes_offset = field->offset;
	    size_t high_bytes_offset = field->offset;
	    FMgetFieldStruct tmp_field;  /*OK */
	    tmp_field = *field;
	    if (WORDS_BIGENDIAN) {
		if (field->byte_swap) {
		    high_bytes_offset += sizeof(long);
		} else {
		    low_bytes_offset += sizeof(long);
		}
	    } else {
		if (field->byte_swap) {
		    low_bytes_offset += sizeof(long);
		} else {
		    high_bytes_offset += sizeof(long);
		}
	    }
	    tmp_field.size = sizeof(long);
	    tmp_field.offset = low_bytes_offset;
	    *low_long = (unsigned long) get_FMulong(&tmp_field, data);
	    if (high_long) {
		tmp_field = *field;
		tmp_field.size = sizeof(long);
		tmp_field.offset = high_bytes_offset;
		*high_long = (long) get_FMlong(&tmp_field, data);
	    }
	} else {
	    *low_long = (long) get_FMlong(field, data);
	}
    } else if (field->data_type == float_type) {
	MAX_FLOAT_TYPE tmp;
	tmp = get_big_float(field, data);
	*low_long = (long) tmp;
    } else {
	fprintf(stderr, "Get IOlong8 failed on invalid data type!\n");
	exit(1);
    }
}